

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::alloc
          (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this,int new_len)

{
  CEditorImage **ppCVar1;
  CEditorImage **ppCVar2;
  ulong uVar3;
  
  this->list_size = new_len;
  uVar3 = 0xffffffffffffffff;
  if (-1 < new_len) {
    uVar3 = (ulong)(uint)new_len << 3;
  }
  ppCVar2 = (CEditorImage **)operator_new__(uVar3);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  ppCVar1 = this->list;
  if (new_len < 1) {
    if (ppCVar1 == (CEditorImage **)0x0) goto LAB_001a2795;
  }
  else {
    uVar3 = 0;
    do {
      ppCVar2[uVar3] = ppCVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)new_len != uVar3);
  }
  operator_delete__(ppCVar1);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_001a2795:
  this->num_elements = new_len;
  this->list = ppCVar2;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}